

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::ScanLineInputFile::Data::readPixels(Data *this,FrameBuffer *fb,int scanLine1,int scanLine2)

{
  int iVar1;
  exr_context_t p_Var2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *pAVar5;
  InputExc *pIVar6;
  TaskGroup *group;
  pointer pSVar7;
  int pn;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  int y_1;
  unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
  sp;
  int y;
  TaskGroup tg;
  ScanLineProcessGroup sg;
  int64_t nchunks;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  int32_t scansperchunk;
  exr_chunk_info_t cinfo;
  exr_attr_box2i_t dw;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
  *in_stack_fffffffffffffb48;
  Data *in_stack_fffffffffffffb50;
  pointer in_stack_fffffffffffffb58;
  FrameBuffer *in_stack_fffffffffffffb60;
  Data *in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  FrameBuffer *in_stack_fffffffffffffb78;
  ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true> *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  ScanLineProcess *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *in_stack_fffffffffffffba0;
  int local_404;
  undefined1 local_400 [104];
  __uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
  local_398;
  stringstream local_390 [16];
  ostream local_380 [96];
  Context *in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffd0c;
  Context *in_stack_fffffffffffffd10;
  stringstream local_1f8 [16];
  ostream local_1e8 [380];
  int local_6c;
  int local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  uint64_t uStack_30;
  exr_attr_box2i_t local_28;
  int local_18;
  int local_14 [5];
  
  local_18 = in_ECX;
  local_14[0] = in_EDX;
  local_28 = Context::dataWindow(in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
  local_6c = 1;
  p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x226e2e);
  iVar1 = exr_get_scanlines_per_chunk(p_Var2,*(undefined4 *)(in_RDI + 8),&local_6c);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1f8);
    poVar3 = std::operator<<(local_1e8,"Error querying scanline counts from image file \"");
    pcVar4 = Context::fileName(in_stack_fffffffffffffce0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\".");
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_1f8);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (local_18 < local_14[0]) {
    std::swap<int>(local_14,&local_18);
  }
  if ((local_14[0] < local_28.min.y) || (local_28.max.y < local_18)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_390);
    poVar3 = std::operator<<(local_380,
                             "Tried to read scan line outside the image file\'s data window: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14[0]);
    poVar3 = std::operator<<(poVar3," - ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3," vs datawindow ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28.min.y);
    poVar3 = std::operator<<(poVar3," - ");
    std::ostream::operator<<(poVar3,local_28.max.y);
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_390);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_398._M_t.
  super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
  .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>._M_head_impl =
       (tuple<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
        )(((long)local_18 - (long)local_14[0]) / (long)local_6c + 1);
  if (((long)local_398._M_t.
             super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
             .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
             _M_head_impl < 2) || (*(int *)(in_RDI + 0xc) < 2)) {
    checkoutScan(in_stack_fffffffffffffb68);
    local_404 = local_14[0];
    while (local_404 <= local_18) {
      p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x2273f5);
      iVar1 = exr_read_scanline_chunk_info(p_Var2,*(undefined4 *)(in_RDI + 8),local_404,&local_68);
      if (iVar1 != 0) {
        pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(pIVar6,"Unable to query scanline information");
        __cxa_throw(pIVar6,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      pSVar7 = std::
               unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
               ::operator->((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                             *)0x2274b0);
      if ((pSVar7->first & 1U) == 0) {
        pSVar7 = std::
                 unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                 ::operator->((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                               *)0x2274c7);
        if ((pSVar7->cinfo).idx != local_68) goto LAB_0022754f;
        pSVar7 = std::
                 unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                 ::operator->((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                               *)0x2274e0);
        if (pSVar7->last_decode_err != 0) goto LAB_0022754f;
        pSVar7 = std::
                 unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                 ::operator->((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                               *)0x2274f2);
        pn = (int)((ulong)pSVar7 >> 0x20);
        Context::operator_cast_to__priv_exr_context_t_((Context *)0x22750a);
        anon_unknown_6::ScanLineProcess::run_unpack
                  ((ScanLineProcess *)CONCAT44(iVar1,in_stack_fffffffffffffb70),
                   (exr_const_context_t)in_stack_fffffffffffffb68,pn,
                   (FrameBuffer *)in_stack_fffffffffffffb58,
                   (int)((ulong)in_stack_fffffffffffffb50 >> 0x20),(int)in_stack_fffffffffffffb50,
                   (vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *)
                   in_stack_fffffffffffffb80);
      }
      else {
LAB_0022754f:
        in_stack_fffffffffffffb50 = (Data *)local_400;
        pSVar7 = std::
                 unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                 ::operator->((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                               *)0x227561);
        (pSVar7->cinfo).sample_count_data_offset = local_38;
        (pSVar7->cinfo).sample_count_table_size = uStack_30;
        (pSVar7->cinfo).packed_size = local_48;
        (pSVar7->cinfo).unpacked_size = uStack_40;
        (pSVar7->cinfo).width = (undefined4)local_58;
        (pSVar7->cinfo).level_x = local_58._4_1_;
        (pSVar7->cinfo).level_y = local_58._5_1_;
        (pSVar7->cinfo).type = local_58._6_1_;
        (pSVar7->cinfo).compression = local_58._7_1_;
        (pSVar7->cinfo).data_offset = uStack_50;
        (pSVar7->cinfo).idx = local_68;
        (pSVar7->cinfo).start_x = uStack_64;
        (pSVar7->cinfo).start_y = iStack_60;
        (pSVar7->cinfo).height = uStack_5c;
        in_stack_fffffffffffffb58 =
             std::
             unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
             ::operator->((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                           *)0x22759b);
        Context::operator_cast_to__priv_exr_context_t_((Context *)0x2275b3);
        anon_unknown_6::ScanLineProcess::run_decode
                  (in_stack_fffffffffffffb90,
                   (exr_const_context_t)
                   CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),in_stack_fffffffffffffb78,iVar1,
                   in_stack_fffffffffffffb70,in_stack_fffffffffffffba0);
      }
      local_404 = local_6c + iStack_60;
    }
    checkinScan(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    std::
    unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
    ::~unique_ptr((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                   *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  }
  else {
    IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true>::ProcessGroup
              ((ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (uint)((ulong)in_stack_fffffffffffffb68 >> 0x20));
    IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)(local_400 + 0x10));
    local_400._12_4_ = local_14[0];
    while ((int)local_400._12_4_ <= local_18) {
      p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x2271e0);
      iVar1 = exr_read_scanline_chunk_info
                        (p_Var2,*(undefined4 *)(in_RDI + 8),local_400._12_4_,&local_68);
      if (iVar1 != 0) {
        pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(pIVar6,"Unable to query scanline information");
        __cxa_throw(pIVar6,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      group = (TaskGroup *)operator_new(0x38);
      LineBufferTask::LineBufferTask
                ((LineBufferTask *)in_stack_fffffffffffffb80,group,
                 (Data *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (ScanLineProcessGroup *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                 (exr_chunk_info_t *)in_stack_fffffffffffffb58,(int)in_stack_fffffffffffffb90,
                 (int)in_stack_fffffffffffffb98);
      IlmThread_3_4::ThreadPool::addGlobalTask((Task *)group);
      local_400._12_4_ = local_6c + iStack_60;
    }
    IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)(local_400 + 0x10));
    IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true>::
    throw_on_failure(in_stack_fffffffffffffb80);
    IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true>::
    ~ProcessGroup((ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true> *)
                  in_stack_fffffffffffffb50);
  }
  return;
}

Assistant:

void ScanLineInputFile::Data::readPixels (
    const FrameBuffer &fb, int scanLine1, int scanLine2)
{
    exr_attr_box2i_t dw = _ctxt->dataWindow (partNumber);
    exr_chunk_info_t cinfo;
    int32_t          scansperchunk = 1;

    if (EXR_ERR_SUCCESS != exr_get_scanlines_per_chunk (*_ctxt, partNumber, &scansperchunk))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error querying scanline counts from image "
            "file \"" << _ctxt->fileName () << "\".");
    }

    if (scanLine2 < scanLine1)
        std::swap (scanLine1, scanLine2);

    if (scanLine1 < dw.min.y || scanLine2 > dw.max.y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Tried to read scan line outside "
            "the image file's data window: "
            << scanLine1 << " - " << scanLine2
            << " vs datawindow "
            << dw.min.y << " - " << dw.max.y);
    }

#if ILMTHREAD_THREADING_ENABLED
    int64_t nchunks;
    nchunks = ((int64_t) scanLine2 - (int64_t) scanLine1);
    nchunks /= (int64_t) scansperchunk;
    nchunks += 1;

    if (nchunks > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        ScanLineProcessGroup sg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int y = scanLine1; y <= scanLine2; )
            {
                if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                    throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

                ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                    new LineBufferTask (&tg, this, &sg, &fb, cinfo, y, scanLine2) );

                y += scansperchunk - (y - cinfo.start_y);
            }
        }

        sg.throw_on_failure ();
    }
    else
#endif
    {
        std::unique_ptr<ScanLineProcess> sp = checkoutScan ();

        for (int y = scanLine1; y <= scanLine2; )
        {
            if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

            // check if we have the same chunk where we can just
            // re-run the unpack (i.e. people reading 1 scan at a time
            // in a multi-scanline chunk)
            if (!sp->first && sp->cinfo.idx == cinfo.idx &&
                sp->last_decode_err == EXR_ERR_SUCCESS)
            {
                sp->run_unpack (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }
            else
            {
                sp->cinfo = cinfo;
                sp->run_decode (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }

            y += scansperchunk - (y - cinfo.start_y);
        }

        checkinScan (sp);
    }
}